

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_zero_Test::
~SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_zero_Test
          (SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_zero_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_fx_spot_stream_Quantity_must_not_be_zero)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    try
    {
        subject_factory.Fx().Quote().Spot()
                .CurrencyPair("EURGBP")
                .Currency("EUR")
                .Quantity(0)
                .LiquidityProvider("CSFX")
                .CreateSubject()
                .ToString().c_str();
    }
    catch (InvalidSubjectException& e)
    {
        ASSERT_STREQ(e.what(), "dealt quantity must be a positive value: 0.00");
        return;
    }

    FAIL();
}